

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool vad_simple(vector<float,_std::allocator<float>_> *pcmf32,int sample_rate,int last_ms,
               float vad_thold,float freq_thold,bool verbose)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  vector<float,_std::allocator<float>_> *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  int i;
  float energy_last;
  float energy_all;
  int n_samples_last;
  int n_samples;
  int local_38;
  float local_34;
  float local_30;
  float in_stack_fffffffffffffff8;
  float in_stack_fffffffffffffffc;
  bool bVar5;
  
  sVar3 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
  iVar1 = (int)sVar3;
  iVar2 = (in_ESI * in_EDX) / 1000;
  if (iVar2 < iVar1) {
    if (0.0 < in_XMM1_Da) {
      high_pass_filter(_i,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
    }
    local_30 = 0.0;
    local_34 = 0.0;
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(long)local_38);
      local_30 = ABS(*pvVar4) + local_30;
      if (iVar1 - iVar2 <= local_38) {
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(long)local_38);
        local_34 = ABS(*pvVar4) + local_34;
      }
    }
    if ((in_CL & 1) != 0) {
      fprintf(_stderr,"%s: energy_all: %f, energy_last: %f, vad_thold: %f, freq_thold: %f\n",
              (double)(local_30 / (float)iVar1),SUB84((double)(local_34 / (float)iVar2),0),
              (double)in_XMM0_Da,(double)in_XMM1_Da,"vad_simple");
    }
    if (local_34 / (float)iVar2 <= in_XMM0_Da * (local_30 / (float)iVar1)) {
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool vad_simple(std::vector<float> & pcmf32, int sample_rate, int last_ms, float vad_thold, float freq_thold, bool verbose) {
    const int n_samples      = pcmf32.size();
    const int n_samples_last = (sample_rate * last_ms) / 1000;

    if (n_samples_last >= n_samples) {
        // not enough samples - assume no speech
        return false;
    }

    if (freq_thold > 0.0f) {
        high_pass_filter(pcmf32, freq_thold, sample_rate);
    }

    float energy_all  = 0.0f;
    float energy_last = 0.0f;

    for (int i = 0; i < n_samples; i++) {
        energy_all += fabsf(pcmf32[i]);

        if (i >= n_samples - n_samples_last) {
            energy_last += fabsf(pcmf32[i]);
        }
    }

    energy_all  /= n_samples;
    energy_last /= n_samples_last;

    if (verbose) {
        fprintf(stderr, "%s: energy_all: %f, energy_last: %f, vad_thold: %f, freq_thold: %f\n", __func__, energy_all, energy_last, vad_thold, freq_thold);
    }

    if (energy_last > vad_thold*energy_all) {
        return false;
    }

    return true;
}